

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O3

void __thiscall
cmComputeLinkInformation::PrintLinkPolicyDiagnosis(cmComputeLinkInformation *this,ostream *os)

{
  pointer pbVar1;
  string *psVar2;
  ostream *poVar3;
  size_type *psVar4;
  pointer pbVar5;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar6;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emitted;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80;
  string local_50;
  
  std::__ostream_insert<char,std::char_traits<char>>
            (os,"Policy CMP0003 should be set before this line.  ",0x30);
  std::__ostream_insert<char,std::char_traits<char>>(os,"Add code such as\n",0x11);
  std::__ostream_insert<char,std::char_traits<char>>(os,"  if(COMMAND cmake_policy)\n",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>(os,"    cmake_policy(SET CMP0003 NEW)\n",0x22);
  std::__ostream_insert<char,std::char_traits<char>>(os,"  endif(COMMAND cmake_policy)\n",0x1e);
  std::__ostream_insert<char,std::char_traits<char>>
            (os,"as early as possible but after the most recent call to ",0x37);
  std::__ostream_insert<char,std::char_traits<char>>
            (os,"cmake_minimum_required or cmake_policy(VERSION).  ",0x32);
  std::__ostream_insert<char,std::char_traits<char>>
            (os,"This warning appears because target \"",0x25);
  psVar2 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,(psVar2->_M_dataplus)._M_p,psVar2->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\" ",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"links to some libraries for which the linker must search:\n",0x3a);
  local_80._M_impl._0_8_ = &local_80._M_impl.super__Rb_tree_header._M_header._M_parent;
  local_80._M_impl.super__Rb_tree_header._M_header._0_8_ = 0;
  local_80._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)
       ((ulong)local_80._M_impl.super__Rb_tree_header._M_header._M_parent & 0xffffffffffffff00);
  pbVar5 = (this->OldUserFlagItems).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->OldUserFlagItems).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar5 != pbVar1) {
    psVar4 = &pbVar5->_M_string_length;
    do {
      if ((local_80._M_impl.super__Rb_tree_header._M_header._0_8_ != 0) &&
         ((*psVar4 + local_80._M_impl.super__Rb_tree_header._M_header._0_8_) - 0x4b <
          0xffffffffffffffb3)) {
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (os,(char *)local_80._M_impl._0_8_,
                            local_80._M_impl.super__Rb_tree_header._M_header._0_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
        local_80._M_impl.super__Rb_tree_header._M_header._0_8_ = 0;
        *(undefined1 *)local_80._M_impl._0_8_ = 0;
      }
      std::__cxx11::string::append((char *)&local_80);
      std::__cxx11::string::_M_append
                ((char *)&local_80,
                 (ulong)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (psVar4 + -1))->_M_dataplus)._M_p);
      pbVar5 = (pointer)(psVar4 + 3);
      psVar4 = psVar4 + 4;
    } while (pbVar5 != pbVar1);
    if (local_80._M_impl.super__Rb_tree_header._M_header._0_8_ != 0) {
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,(char *)local_80._M_impl._0_8_,
                          local_80._M_impl.super__Rb_tree_header._M_header._0_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    }
    if ((_Base_ptr *)local_80._M_impl._0_8_ !=
        &local_80._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)local_80._M_impl._0_8_,
                      (ulong)((long)&(local_80._M_impl.super__Rb_tree_header._M_header._M_parent)->
                                     _M_color + 1));
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (os,"and other libraries with known full path:\n",0x2a);
  local_80._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_80._M_impl.super__Rb_tree_header._M_header;
  local_80._M_impl.super__Rb_tree_header._M_header._0_8_ =
       local_80._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  local_80._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_80._M_impl.super__Rb_tree_header._M_node_count = 0;
  pbVar5 = (this->OldLinkDirItems).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->OldLinkDirItems).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_80._M_impl.super__Rb_tree_header._M_header._M_right =
       local_80._M_impl.super__Rb_tree_header._M_header._M_left;
  if (pbVar5 != pbVar1) {
    do {
      cmsys::SystemTools::GetFilenamePath(&local_50,pbVar5);
      pVar6 = std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&local_80,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        std::__ostream_insert<char,std::char_traits<char>>(os,"  ",2);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (os,(pbVar5->_M_dataplus)._M_p,pbVar5->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
      }
      pbVar5 = pbVar5 + 1;
    } while (pbVar5 != pbVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (os,"CMake is adding directories in the second list to the linker ",0x3d);
  std::__ostream_insert<char,std::char_traits<char>>
            (os,"search path in case they are needed to find libraries from the ",0x3f);
  std::__ostream_insert<char,std::char_traits<char>>
            (os,"first list (for backwards compatibility with CMake 2.4).  ",0x3a);
  std::__ostream_insert<char,std::char_traits<char>>
            (os,"Set policy CMP0003 to OLD or NEW to enable or disable this ",0x3b);
  std::__ostream_insert<char,std::char_traits<char>>(os,"behavior explicitly.  ",0x16);
  std::__ostream_insert<char,std::char_traits<char>>
            (os,"Run \"cmake --help-policy CMP0003\" for more information.",0x37);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_80);
  return;
}

Assistant:

void cmComputeLinkInformation::PrintLinkPolicyDiagnosis(std::ostream& os)
{
  // Tell the user what to do.
  /* clang-format off */
  os << "Policy CMP0003 should be set before this line.  "
     << "Add code such as\n"
     << "  if(COMMAND cmake_policy)\n"
     << "    cmake_policy(SET CMP0003 NEW)\n"
     << "  endif(COMMAND cmake_policy)\n"
     << "as early as possible but after the most recent call to "
     << "cmake_minimum_required or cmake_policy(VERSION).  ";
  /* clang-format on */

  // List the items that might need the old-style paths.
  os << "This warning appears because target \"" << this->Target->GetName()
     << "\" "
     << "links to some libraries for which the linker must search:\n";
  {
    // Format the list of unknown items to be as short as possible while
    // still fitting in the allowed width (a true solution would be the
    // bin packing problem if we were allowed to change the order).
    std::string::size_type max_size = 76;
    std::string line;
    const char* sep = "  ";
    for (std::string const& i : this->OldUserFlagItems) {
      // If the addition of another item will exceed the limit then
      // output the current line and reset it.  Note that the separator
      // is either " " or ", " which is always 2 characters.
      if (!line.empty() && (line.size() + i.size() + 2) > max_size) {
        os << line << "\n";
        sep = "  ";
        line.clear();
      }
      line += sep;
      line += i;
      // Convert to the other separator.
      sep = ", ";
    }
    if (!line.empty()) {
      os << line << "\n";
    }
  }

  // List the paths old behavior is adding.
  os << "and other libraries with known full path:\n";
  std::set<std::string> emitted;
  for (std::string const& i : this->OldLinkDirItems) {
    if (emitted.insert(cmSystemTools::GetFilenamePath(i)).second) {
      os << "  " << i << "\n";
    }
  }

  // Explain.
  os << "CMake is adding directories in the second list to the linker "
     << "search path in case they are needed to find libraries from the "
     << "first list (for backwards compatibility with CMake 2.4).  "
     << "Set policy CMP0003 to OLD or NEW to enable or disable this "
     << "behavior explicitly.  "
     << "Run \"cmake --help-policy CMP0003\" for more information.";
}